

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O0

void __thiscall FListMenuItemPlayerDisplay::Ticker(FListMenuItemPlayerDisplay *this)

{
  int iVar1;
  FState *pFVar2;
  FListMenuItemPlayerDisplay *this_local;
  
  if (this->mClassNum < 0) {
    UpdateRandomClass(this);
  }
  if ((((this->mPlayerState != (FState *)0x0) &&
       (iVar1 = FState::GetTics(this->mPlayerState), iVar1 != -1)) &&
      (pFVar2 = FState::GetNextState(this->mPlayerState), pFVar2 != (FState *)0x0)) &&
     (iVar1 = this->mPlayerTics + -1, this->mPlayerTics = iVar1, iVar1 < 1)) {
    pFVar2 = FState::GetNextState(this->mPlayerState);
    this->mPlayerState = pFVar2;
    iVar1 = FState::GetTics(this->mPlayerState);
    this->mPlayerTics = iVar1;
  }
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Ticker()
{
	if (mClassNum < 0) UpdateRandomClass();

	if (mPlayerState != NULL && mPlayerState->GetTics () != -1 && mPlayerState->GetNextState () != NULL)
	{
		if (--mPlayerTics <= 0)
		{
			mPlayerState = mPlayerState->GetNextState();
			mPlayerTics = mPlayerState->GetTics();
		}
	}
}